

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNTests.cpp
# Opt level: O3

void __thiscall IsNotNaNTests::ThenIsNotNanXIsNotTrue<double>(IsNotNaNTests *this,double value)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  allocator local_2b9;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  undefined4 uStack_2a0;
  undefined4 uStack_29c;
  double local_298;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 local_260;
  undefined8 uStack_258;
  ulong *local_250;
  long local_248;
  ulong local_240;
  long lStack_238;
  ulong *local_230;
  long local_228;
  ulong local_220 [2];
  ulong *local_210;
  long local_208;
  ulong local_200 [2];
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  double local_1d0 [2];
  code *local_1c0;
  code *local_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0 [14];
  ios_base local_130 [264];
  
  local_298 = value;
  local_1f0 = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Is::Not::NaN(","");
  std::__cxx11::string::string((string *)&local_210,__exception + (*__exception == '*'),&local_2b9);
  uVar5 = 0xf;
  if (local_1f0 != local_1e0) {
    uVar5 = local_1e0[0];
  }
  if (uVar5 < (ulong)(local_208 + local_1e8)) {
    uVar5 = 0xf;
    if (local_210 != local_200) {
      uVar5 = local_200[0];
    }
    if (uVar5 < (ulong)(local_208 + local_1e8)) goto LAB_001ec8e9;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_1f0);
  }
  else {
LAB_001ec8e9:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_210);
  }
  local_290 = &local_280;
  puVar1 = puVar2 + 2;
  if ((undefined8 *)*puVar2 == puVar1) {
    local_280 = *puVar1;
    uStack_278 = puVar2[3];
  }
  else {
    local_280 = *puVar1;
    local_290 = (undefined8 *)*puVar2;
  }
  local_288 = puVar2[1];
  *puVar2 = puVar1;
  puVar2[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_290);
  puVar4 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar4) {
    local_240 = *puVar4;
    lStack_238 = plVar3[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *puVar4;
    local_250 = (ulong *)*plVar3;
  }
  local_248 = plVar3[1];
  *plVar3 = (long)puVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b0);
  std::ostream::_M_insert<double>(local_298);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b0);
  std::ios_base::~ios_base(local_130);
  uVar5 = 0xf;
  if (local_250 != &local_240) {
    uVar5 = local_240;
  }
  if (uVar5 < (ulong)(local_228 + local_248)) {
    uVar5 = 0xf;
    if (local_230 != local_220) {
      uVar5 = local_220[0];
    }
    if (uVar5 < (ulong)(local_228 + local_248)) goto LAB_001eca62;
    puVar2 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_250);
  }
  else {
LAB_001eca62:
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_230);
  }
  local_2b8 = &local_2a8;
  puVar4 = puVar2 + 2;
  if ((ulong *)*puVar2 == puVar4) {
    local_2a8 = *puVar4;
    uStack_2a0 = *(undefined4 *)(puVar2 + 3);
    uStack_29c = *(undefined4 *)((long)puVar2 + 0x1c);
  }
  else {
    local_2a8 = *puVar4;
    local_2b8 = (ulong *)*puVar2;
  }
  local_2b0 = puVar2[1];
  *puVar2 = puVar4;
  puVar2[1] = 0;
  *(undefined1 *)puVar4 = 0;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,") is Not True","");
  uVar5 = 0xf;
  if (local_2b8 != &local_2a8) {
    uVar5 = local_2a8;
  }
  if (uVar5 < (ulong)(local_1a8 + local_2b0)) {
    uVar5 = 0xf;
    if (local_1b0 != local_1a0) {
      uVar5 = local_1a0[0];
    }
    if ((ulong)(local_1a8 + local_2b0) <= uVar5) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_2b8);
      goto LAB_001ecb4d;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_1b0);
LAB_001ecb4d:
  local_270 = &local_260;
  puVar1 = puVar2 + 2;
  if ((undefined8 *)*puVar2 == puVar1) {
    local_260 = *puVar1;
    uStack_258 = puVar2[3];
  }
  else {
    local_260 = *puVar1;
    local_270 = (undefined8 *)*puVar2;
  }
  local_268 = puVar2[1];
  *puVar2 = puVar1;
  puVar2[1] = 0;
  *(undefined1 *)puVar1 = 0;
  local_1d0[1] = 0.0;
  local_1d0[0] = local_298;
  local_1b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/NaNTests.cpp:63:141)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MorleyDev[P]UnitTest11/tests/Unit/Is/NaNTests.cpp:63:141)>
              ::_M_manager;
  (*(this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract[6])
            (this,&local_270);
  if (local_1c0 != (code *)0x0) {
    (*local_1c0)(local_1d0,local_1d0,3);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8);
  }
  if (local_230 != local_220) {
    operator_delete(local_230);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  return;
}

Assistant:

void ThenIsNotNanXIsNotTrue(T value)
	{
		Then(std::string("Is::Not::NaN(") + std::string(typeid(T).name()) + ": " + ut11::utility::ToString(value) + std::string(") is Not True"), [value]() {
			AssertThat(ut11::Is::Not::NaN(value), ut11::Is::Not::True);
		});
	}